

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O3

void __thiscall QMdiSubWindow::paintEvent(QMdiSubWindow *this,QPaintEvent *paintEvent)

{
  QStyleOptionTitleBar *pQVar1;
  int iVar2;
  QMdiSubWindowPrivate *this_00;
  QWidgetData *pQVar3;
  QArrayData *pQVar4;
  char16_t *pcVar5;
  undefined1 *puVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  undefined4 uVar12;
  uint uVar13;
  QStyle *pQVar14;
  QWidgetPrivate *pQVar15;
  int iVar16;
  QWidget *pQVar17;
  long in_FS_OFFSET;
  bool bVar18;
  QStyleOptionFrame frameOptions;
  long local_d8;
  undefined8 local_d0;
  undefined1 local_c8 [16];
  QStyle *local_b8;
  undefined1 local_a8 [16];
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  QPalettePrivate *pQStack_80;
  undefined1 *local_78;
  QObject *pQStack_70;
  undefined1 *local_68;
  QArrayData *pQStack_60;
  QIcon local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMdiSubWindowPrivate **)&(this->super_QWidget).field_0x8;
  if ((*(long *)&(this_00->super_QWidgetPrivate).field_0x10 == 0) ||
     (((((this->super_QWidget).data)->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 0x800) != 0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QWidget::paintEvent(&this->super_QWidget,paintEvent);
      return;
    }
    goto LAB_0045153a;
  }
  if ((this_00->resizeTimer).m_id == Invalid) {
    QMdiSubWindowPrivate::titleBarOptions((QStyleOptionTitleBar *)local_a8,this_00);
    QStyleOptionTitleBar::operator=(&this_00->cachedStyleOptions,(QStyleOptionTitleBar *)local_a8);
    QIcon::~QIcon(local_48);
    if (pQStack_60 != (QArrayData *)0x0) {
      LOCK();
      (pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQStack_60,2,0x10);
      }
    }
    QStyleOption::~QStyleOption((QStyleOption *)local_a8);
  }
  else {
    pQVar1 = &this_00->cachedStyleOptions;
    pQVar17 = *(QWidget **)&(this_00->super_QWidgetPrivate).field_0x8;
    pQVar14 = QWidget::style(pQVar17);
    iVar10 = (**(code **)(*(long *)pQVar14 + 0xf0))(pQVar14,0x1a,pQVar1,pQVar17,0);
    bVar18 = iVar10 == 0;
    iVar16 = (uint)!bVar18 * 4 + -4;
    iVar11 = QMdiSubWindowPrivate::titleBarHeight(this_00,pQVar1);
    bVar9 = QWidget::isMinimized(&this->super_QWidget);
    pQVar3 = (this->super_QWidget).data;
    iVar10 = (pQVar3->crect).x2.m_i;
    iVar2 = (pQVar3->crect).x1.m_i;
    (this_00->cachedStyleOptions).super_QStyleOptionComplex.super_QStyleOption.rect.x1.m_i =
         (uint)bVar18 * 4;
    (this_00->cachedStyleOptions).super_QStyleOptionComplex.super_QStyleOption.rect.y1.m_i =
         (uint)bVar18 * 4;
    (this_00->cachedStyleOptions).super_QStyleOptionComplex.super_QStyleOption.rect.x2.m_i =
         (iVar16 + iVar10) - iVar2;
    (this_00->cachedStyleOptions).super_QStyleOptionComplex.super_QStyleOption.rect.y2.m_i =
         iVar11 + (uint)bVar18 * 4 + (iVar16 << bVar9) + -1;
    if ((this_00->windowTitle).d.size != 0) {
      pQVar14 = QWidget::style(&this->super_QWidget);
      (**(code **)(*(long *)pQVar14 + 0xd8))(pQVar14,5,pQVar1,0x100,this);
      QFontMetrics::elidedText((QString *)local_a8,(int)this_00 + 0x408,(int)this_00 + 0x3b8,1);
      pQVar4 = &((this_00->cachedStyleOptions).text.d.d)->super_QArrayData;
      pcVar5 = (this_00->cachedStyleOptions).text.d.ptr;
      (this_00->cachedStyleOptions).text.d.d = (Data *)local_a8._0_8_;
      (this_00->cachedStyleOptions).text.d.ptr = (char16_t *)local_a8._8_8_;
      puVar6 = (undefined1 *)(this_00->cachedStyleOptions).text.d.size;
      (this_00->cachedStyleOptions).text.d.size = (qsizetype)local_98;
      local_a8._0_8_ = pQVar4;
      local_a8._8_8_ = pcVar5;
      local_98 = puVar6;
      if (pQVar4 != (QArrayData *)0x0) {
        LOCK();
        (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar4,2,0x10);
        }
      }
    }
  }
  local_b8 = (QStyle *)&DAT_aaaaaaaaaaaaaaaa;
  local_c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)local_c8);
  local_c8._8_8_ = this;
  local_b8 = QWidget::style(&this->super_QWidget);
  QPainter::begin((QPaintDevice *)local_c8);
  QPainter::setRenderHint((RenderHint)(QPainter *)local_c8,true);
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_60 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_70 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_80 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionFrame::QStyleOptionFrame((QStyleOptionFrame *)local_a8);
  QStyleOption::initFrom((QStyleOption *)local_a8,&this->super_QWidget);
  local_a8._8_4_ = (uint)this_00->isActive << 0x10 | local_a8._8_4_ & 0xfffeffff;
  bVar9 = QWidget::isMaximized(&this->super_QWidget);
  if ((!bVar9) || (bVar9 = QMdiSubWindowPrivate::drawTitleBarWhenMaximized(this_00), bVar9)) {
    if ((this_00->windowTitle).d.size != 0) {
      QPainter::setFont((QFont *)local_c8);
    }
    pQVar1 = &this_00->cachedStyleOptions;
    (**(code **)(*(long *)local_b8 + 200))(local_b8,5,pQVar1,local_c8,local_c8._8_8_);
    bVar9 = QWidget::isMinimized(&this->super_QWidget);
    if (bVar9) {
      pQVar17 = *(QWidget **)&(this_00->super_QWidgetPrivate).field_0x8;
      pQVar14 = QWidget::style(pQVar17);
      iVar10 = (**(code **)(*(long *)pQVar14 + 0xf0))(pQVar14,0x1a,pQVar1,pQVar17,0);
      if (iVar10 != 0) goto LAB_00451501;
    }
    pQVar14 = QWidget::style(&this->super_QWidget);
    uVar12 = (**(code **)(*(long *)pQVar14 + 0xe0))(pQVar14,0x2c,0,this);
    local_68 = (undefined1 *)CONCAT44(local_68._4_4_,uVar12);
    bVar9 = QWidget::isMinimized(&this->super_QWidget);
    if (!bVar9) {
      pQVar17 = *(QWidget **)&(this_00->super_QWidgetPrivate).field_0x8;
      pQVar14 = QWidget::style(pQVar17);
      iVar10 = (**(code **)(*(long *)pQVar14 + 0xf0))(pQVar14,0x1a,pQVar1,pQVar17,0);
      if (iVar10 != 0) {
        pQVar3 = (this->super_QWidget).data;
        iVar10 = (pQVar3->crect).x2.m_i;
        iVar2 = (pQVar3->crect).x1.m_i;
        iVar11 = (pQVar3->crect).y2.m_i;
        iVar16 = (pQVar3->crect).y1.m_i;
        uVar13 = QMdiSubWindowPrivate::titleBarHeight(this_00,pQVar1);
        local_d8 = (ulong)uVar13 << 0x20;
        local_d0 = CONCAT44(iVar11 - iVar16,iVar10 - iVar2);
        QPainter::setClipRect((QRect *)local_c8,(ClipOperation)&local_d8);
      }
    }
    bVar9 = QWidget::isMinimized(&this->super_QWidget);
    if (bVar9) {
      pQVar17 = *(QWidget **)&(this_00->super_QWidgetPrivate).field_0x8;
      pQVar14 = QWidget::style(pQVar17);
      iVar10 = (**(code **)(*(long *)pQVar14 + 0xf0))(pQVar14,0x1a,pQVar1,pQVar17,0);
      if (iVar10 != 0) goto LAB_00451501;
    }
LAB_004514e1:
    (**(code **)(*(long *)local_b8 + 0xb0))(local_b8,9,local_a8,local_c8,local_c8._8_8_);
  }
  else {
    bVar9 = QWidget::autoFillBackground(&this->super_QWidget);
    if (!bVar9) {
      lVar7 = *(long *)&(this->super_QWidget).field_0x8;
      lVar8 = *(long *)(lVar7 + 600);
      if (((lVar8 != 0) && (*(int *)(lVar8 + 4) != 0)) &&
         (pQVar17 = *(QWidget **)(lVar7 + 0x260), pQVar17 != (QWidget *)0x0)) {
        if (*(int *)(lVar8 + 4) == 0) {
          pQVar17 = (QWidget *)0x0;
        }
        pQVar15 = qt_widget_private(pQVar17);
        if ((pQVar15->field_0x252 & 2) != 0) goto LAB_00451501;
      }
      goto LAB_004514e1;
    }
  }
LAB_00451501:
  QStyleOption::~QStyleOption((QStyleOption *)local_a8);
  QPainter::~QPainter((QPainter *)local_c8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0045153a:
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindow::paintEvent(QPaintEvent *paintEvent)
{
    if (!parent() || (windowFlags() & Qt::FramelessWindowHint)) {
        QWidget::paintEvent(paintEvent);
        return;
    }

    Q_D(QMdiSubWindow);

    if (d->resizeTimer.isActive()) {
        // Only update the style option rect and the window title.
        int border = d->hasBorder(d->cachedStyleOptions) ? 4 : 0;
        int titleBarHeight = d->titleBarHeight(d->cachedStyleOptions);
        titleBarHeight -= isMinimized() ? 2 * border : border;
        d->cachedStyleOptions.rect = QRect(border, border, width() - 2 * border, titleBarHeight);
        if (!d->windowTitle.isEmpty()) {
            int width = style()->subControlRect(QStyle::CC_TitleBar, &d->cachedStyleOptions,
                                                QStyle::SC_TitleBarLabel, this).width();
            d->cachedStyleOptions.text = d->cachedStyleOptions.fontMetrics
                                         .elidedText(d->windowTitle, Qt::ElideRight, width);
        }
    } else {
        // Force full update.
        d->cachedStyleOptions = d->titleBarOptions();
    }

    QStylePainter painter(this);
    QStyleOptionFrame frameOptions;
    frameOptions.initFrom(this);
    frameOptions.state.setFlag(QStyle::State_Active, d->isActive);
    if (isMaximized() && !d->drawTitleBarWhenMaximized()) {
        if (!autoFillBackground() && (!widget() || !qt_widget_private(widget())->isOpaque)) {
            // make sure we paint all pixels of a maximized QMdiSubWindow if no-one else does
            painter.drawPrimitive(QStyle::PE_FrameWindow, frameOptions);
        }
        return;
    }

    if (!d->windowTitle.isEmpty())
        painter.setFont(d->font);
    painter.drawComplexControl(QStyle::CC_TitleBar, d->cachedStyleOptions);

    if (isMinimized() && !d->hasBorder(d->cachedStyleOptions))
        return;

    frameOptions.lineWidth = style()->pixelMetric(QStyle::PM_MdiSubWindowFrameWidth, nullptr, this);

    // ### Ensure that we do not require setting the cliprect for 4.4
    if (!isMinimized() && !d->hasBorder(d->cachedStyleOptions))
        painter.setClipRect(rect().adjusted(0, d->titleBarHeight(d->cachedStyleOptions), 0, 0));
    if (!isMinimized() || d->hasBorder(d->cachedStyleOptions))
        painter.drawPrimitive(QStyle::PE_FrameWindow, frameOptions);
}